

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_palette.c
# Opt level: O0

bool_t prf_color_palette_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort uVar1;
  bfile_t *in_RDX;
  uint16_t *in_RDI;
  prf_color_name_data *cdata;
  uint8_t *ptr;
  uint i;
  uint num;
  node_data *data;
  int pos;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar2;
  uint uVar3;
  ushort *local_40;
  uint local_38;
  long in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  bool_t local_4;
  
  if (*in_RDI == prf_color_palette_info.opcode) {
    bf_put_uint16_be((bfile_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (uint16_t)(in_stack_ffffffffffffffac >> 0x10));
    bf_put_uint16_be((bfile_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (uint16_t)(in_stack_ffffffffffffffac >> 0x10));
    iVar4 = 4;
    if (0x83 < in_RDI[1]) {
      in_stack_ffffffffffffffd0 = *(long *)(in_RDI + 4);
      bf_write(in_RDX,(uint8_t *)CONCAT44(4,in_stack_ffffffffffffffd8),
               (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      iVar4 = iVar4 + 0x80;
      if ((int)(in_RDI[1] - 0x84) / 4 < 0x401) {
        uVar2 = (int)(in_RDI[1] - 0x84) / 4;
      }
      else {
        uVar2 = 0x400;
      }
      uVar3 = uVar2;
      for (local_38 = 0; local_38 < uVar2; local_38 = local_38 + 1) {
        bf_put_uint32_be((bfile_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
        iVar4 = iVar4 + 4;
      }
      if (iVar4 + 4 <= (int)(uint)in_RDI[1]) {
        bf_put_uint32_be((bfile_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
        iVar4 = iVar4 + 4;
        local_40 = (ushort *)(*(long *)(in_RDI + 4) + (long)iVar4 + -4);
        local_38 = 0;
        for (; (local_38 < *(uint *)(in_stack_ffffffffffffffd0 + 0x1080) &&
               ((int)(iVar4 + (uint)*local_40) <= (int)(uint)in_RDI[1]));
            iVar4 = (uint)uVar1 + iVar4) {
          bf_put_uint16_be((bfile_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                           (uint16_t)(in_stack_ffffffffffffffac >> 0x10));
          bf_put_uint16_be((bfile_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                           (uint16_t)(in_stack_ffffffffffffffac >> 0x10));
          bf_put_uint16_be((bfile_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                           (uint16_t)(in_stack_ffffffffffffffac >> 0x10));
          bf_put_uint16_be((bfile_t *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                           (uint16_t)(in_stack_ffffffffffffffac >> 0x10));
          bf_write(in_RDX,(uint8_t *)CONCAT44(iVar4,in_stack_ffffffffffffffd8),
                   (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
          uVar1 = *local_40;
          local_40 = (ushort *)((long)local_40 + (long)(int)(uint)*local_40);
          local_38 = local_38 + 1;
        }
      }
    }
    if (iVar4 < (int)(uint)in_RDI[1]) {
      bf_write(in_RDX,(uint8_t *)CONCAT44(iVar4,in_stack_ffffffffffffffd8),
               (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    }
    local_4 = 1;
  }
  else {
    prf_error(3,"tried color palette save method on other node");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static
bool_t
prf_color_palette_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_color_palette_info.opcode ) {
        prf_error( 3, "tried color palette save method on other node" );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        unsigned int num, i;
        uint8_t * ptr;
        if ( node->length < (pos + 128) ) break;
        data = (node_data *) node->data;
        bf_write( bfile, (uint8_t *) data->reserved1, 128 ); pos += 128;
        num = PRF_MIN( 1024, ((node->length - 132) / 4) );
        for ( i = 0; i < num; i++ ) {
            bf_put_uint32_be( bfile, data->brightest_rgb[i] ); pos += 4;
        }
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->num_color_names ); pos += 4;
        ptr = node->data + pos - 4;

        for ( i = 0; i < data->num_color_names; i++ ) {
            struct prf_color_name_data * cdata;
            cdata = (struct prf_color_name_data *) ptr;
            if ( node->length < (pos + cdata->length) ) break;
            bf_put_uint16_be( bfile, cdata->length );
            bf_put_uint16_be( bfile, cdata->reserved1 );
            bf_put_uint16_be( bfile, cdata->index );
            bf_put_uint16_be( bfile, cdata->reserved2 );
            bf_write( bfile, (uint8_t *) cdata->name, cdata->length - 8 );
            pos += cdata->length;
            ptr += cdata->length;
        }

    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}